

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

uint8_t * __thiscall arangodb::velocypack::ArrayIterator::first(ArrayIterator *this)

{
  uint8_t head;
  ValueLength VVar1;
  uint8_t *puVar2;
  
  if (this->_size == 0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = (this->_slice)._start;
    head = *puVar2;
    if (head == '\x13') {
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
              getStartOffsetFromCompact
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                        );
    }
    else {
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::findDataOffset
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                         ,head);
    }
    puVar2 = puVar2 + VVar1;
  }
  return puVar2;
}

Assistant:

[[nodiscard]] uint8_t const* first() const noexcept {
    if (VELOCYPACK_UNLIKELY(_size == 0)) {
      return nullptr;
    }
    auto const head = _slice.head();
    VELOCYPACK_ASSERT(head != 0x01);  // no empty array allowed here
    if (head == 0x13) {
      return _slice.start() + _slice.getStartOffsetFromCompact();
    }
    return _slice.begin() + _slice.findDataOffset(head);
  }